

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

float __thiscall
Ptex::v2_2::PtexSeparableKernel::makeSymmetric(PtexSeparableKernel *this,float initialWeight)

{
  char cVar1;
  char cVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  
  cVar1 = (this->res).ulog2;
  cVar2 = (this->res).vlog2;
  if (cVar2 < cVar1) {
    do {
      downresU(this);
    } while ((this->res).vlog2 < (this->res).ulog2);
  }
  else if (cVar1 < cVar2) {
    do {
      downresV(this);
    } while ((this->res).ulog2 < (this->res).vlog2);
  }
  uVar5 = this->vw;
  if (this->uw < this->vw) {
    uVar5 = this->uw;
  }
  this->vw = uVar5;
  this->uw = uVar5;
  fVar7 = 0.0;
  if (0 < (int)uVar5) {
    pfVar3 = this->ku;
    pfVar4 = this->kv;
    uVar6 = 0;
    do {
      fVar8 = pfVar3[uVar6] + pfVar4[uVar6];
      pfVar4[uVar6] = fVar8;
      pfVar3[uVar6] = fVar8;
      fVar7 = fVar7 + fVar8;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  fVar7 = fVar7 * fVar7;
  fVar8 = (float)(-(uint)(fVar7 == 0.0) & 0x3f800000 |
                 ~-(uint)(fVar7 == 0.0) & (uint)(initialWeight / fVar7));
  if (fVar8 < 1.0) {
    if (-1.0 <= fVar8) {
      fVar7 = initialWeight;
      if (0 < (int)uVar5) {
        pfVar3 = this->ku;
        uVar6 = 0;
        do {
          pfVar3[uVar6] = pfVar3[uVar6] * fVar8;
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
    }
    else {
      if (0 < (int)uVar5) {
        pfVar3 = this->ku;
        uVar6 = 0;
        do {
          pfVar3[uVar6] = -pfVar3[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      fVar7 = -fVar7;
    }
  }
  return fVar7;
}

Assistant:

float makeSymmetric(float initialWeight)
    {
        assert(u == 0 && v == 0);

        // downres higher-res dimension until equal
        if (res.ulog2 > res.vlog2) {
            do { downresU(); } while(res.ulog2 > res.vlog2);
        }
        else if (res.vlog2 > res.ulog2) {
            do { downresV(); } while (res.vlog2 > res.ulog2);
        }

        // truncate excess samples in longer dimension
        uw = vw = PtexUtils::min(uw, vw);

        // combine corresponding u and v samples and compute new kernel weight
        float newWeight = 0;
        for (int i = 0; i < uw; i++) {
            float sum = ku[i] + kv[i];
            ku[i] = kv[i] = sum;
            newWeight += sum;
        }
        newWeight *= newWeight; // equivalent to k.weight() ( = sum(ku)*sum(kv) )

        // compute scale factor to compensate for weight change
        float scale = newWeight == 0 ? 1.f : initialWeight / newWeight;

        // Note: a sharpening kernel (like Mitchell) can produce
        // negative weights which may cancel out when adding the two
        // kernel axes together, and this can cause the compensation
        // scale factor to spike up.  We expect the scale factor to be
        // less than one in "normal" cases (i.e. ku*kv <= (ku+kv)^2 if ku
        // and kv are both positive), so clamping to -1..1 will have
        // no effect on positive kernels.  If there are negative
        // weights, the clamping will just limit the amount of
        // sharpening happening at the corners, and the result will
        // still be smooth.

        // clamp scale factor to -1..1 range
        if (scale >= 1) {
            // scale by 1 (i.e. do nothing)
        }
        else {
            if (scale < -1) {
                // a negative scale means the original kernel had an overall negative weight
                // after making symmetric, the kernel will always be positive
                // scale ku by -1
                // note: choice of u is arbitrary; we could have scaled u or v (but not both)
                for (int i = 0; i < uw; i++) ku[i] *= -1;
                newWeight = -newWeight;
            }
            else {
                // scale ku to restore initialWeight (again, choice of u instead of v is arbitrary)
                for (int i = 0; i < uw; i++) ku[i] *= scale;
                newWeight = initialWeight;
            }
        }
        return newWeight;
    }